

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

void __thiscall HEkk::debugReportInitialBasis(HEkk *this)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_60;
  
  uVar9 = (this->lp_).num_col_;
  uVar7 = (ulong)uVar9;
  uVar10 = (this->lp_).num_row_;
  iVar15 = uVar10 + uVar9;
  local_78 = 0;
  if ((int)uVar9 < 1) {
    local_90 = 0;
    local_80 = 0;
    local_88 = 0;
    uVar6 = 0;
    local_60 = 0;
  }
  else {
    uVar12 = 0;
    local_60 = 0;
    uVar6 = 0;
    local_88 = 0;
    local_80 = 0;
    local_90 = 0;
    do {
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar12] == '\0') {
        local_60 = (ulong)((int)local_60 + 1);
      }
      else {
        cVar4 = (this->basis_).nonbasicMove_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        if (cVar4 < '\x01') {
          if (cVar4 < '\0') {
            local_88 = (ulong)((int)local_88 + 1);
          }
          else {
            dVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12];
            pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar12;
            if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
              local_90 = (ulong)((int)local_90 + 1);
            }
            else {
              local_80 = (ulong)((int)local_80 + 1);
            }
          }
        }
        else {
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        if (iVar15 < 0x19) {
          highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                      "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                      (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12],
                      (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12],
                      (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12],uVar12 & 0xffffffff,uVar6,
                      local_88,local_80,local_90);
          uVar7 = (ulong)(uint)(this->lp_).num_col_;
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(int)uVar7);
    uVar10 = (this->lp_).num_row_;
  }
  uVar12 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar14 = 0;
    uVar11 = 0;
    uVar13 = 0;
    uVar8 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    uVar13 = 0;
    uVar11 = 0;
    uVar14 = 0;
    local_78 = 0;
    do {
      lVar5 = (long)(this->lp_).num_col_;
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar7 + lVar5] == '\0') {
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      else {
        lVar2 = lVar5 + uVar7;
        cVar4 = (this->basis_).nonbasicMove_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7 + lVar5];
        if (cVar4 < '\x01') {
          if (cVar4 < '\0') {
            uVar11 = (ulong)((int)uVar11 + 1);
          }
          else {
            dVar3 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar2];
            pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar2;
            if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
              uVar14 = (ulong)((int)uVar14 + 1);
            }
            else {
              local_78 = (ulong)((int)local_78 + 1);
            }
          }
        }
        else {
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        if (iVar15 < 0x19) {
          highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                      "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                      (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2],
                      (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2],
                      (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar2],uVar7 & 0xffffffff,uVar13,
                      uVar11,local_78,uVar14);
          uVar12 = (ulong)(uint)(this->lp_).num_row_;
        }
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < (int)uVar12);
    uVar7 = (ulong)(uint)(this->lp_).num_col_;
  }
  uVar9 = (int)local_88 + (int)uVar6 + (int)local_90 + (int)local_80;
  uVar10 = (int)uVar11 + (int)uVar13 + (int)uVar14 + (int)local_78;
  highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
              "For %d columns and %d rows\n   NonBasic |  Lower  Upper  Fixed   Free |    Basic\nCol %7d |%7d%7d%7d%7d |  %7d\nRow %7d |%7d%7d%7d%7d |  %7d\n----------------------------------------------------\n    %7d |%7d%7d%7d%7d |  %7d\n"
              ,uVar7,uVar12,(ulong)uVar9,uVar6,local_88,local_80,local_90,local_60,(ulong)uVar10,
              uVar13,uVar11,local_78,uVar14,uVar8,(ulong)(uVar10 + uVar9),
              (ulong)(uint)((int)uVar13 + (int)uVar6),(ulong)(uint)((int)uVar11 + (int)local_88),
              (ulong)(uint)((int)local_78 + (int)local_80),
              (ulong)(uint)((int)local_90 + (int)uVar14),(ulong)(uint)((int)uVar8 + (int)local_60));
  return;
}

Assistant:

void HEkk::debugReportInitialBasis() {
  HighsInt num_col_basic = 0;
  HighsInt num_col_lower = 0;
  HighsInt num_col_upper = 0;
  HighsInt num_col_fixed = 0;
  HighsInt num_col_free = 0;
  HighsInt num_row_basic = 0;
  HighsInt num_row_lower = 0;
  HighsInt num_row_upper = 0;
  HighsInt num_row_fixed = 0;
  HighsInt num_row_free = 0;
  std::vector<double>& lower = info_.workLower_;
  std::vector<double>& upper = info_.workUpper_;
  std::vector<double>& value = info_.workValue_;
  const bool detail = lp_.num_col_ + lp_.num_row_ < 25;
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    HighsInt iVar = iCol;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_col_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_col_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_col_upper++;
    } else if (lower[iCol] == upper[iCol]) {
      num_col_fixed++;
    } else {
      num_col_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Col %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iCol, lower[iCol], value[iVar], upper[iCol],
                  num_col_lower, num_col_upper, num_col_fixed, num_col_free);
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = lp_.num_col_ + iRow;
    if (!basis_.nonbasicFlag_[iVar]) {
      num_row_basic++;
      continue;
    }
    if (basis_.nonbasicMove_[iVar] > 0) {
      num_row_lower++;
    } else if (basis_.nonbasicMove_[iVar] < 0) {
      num_row_upper++;
    } else if (lower[iVar] == upper[iVar]) {
      num_row_fixed++;
    } else {
      num_row_free++;
    }
    if (detail)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "Row %3d [%11.4g, %11.4g, %11.4g] %3d %3d %3d %3d\n",
                  (int)iRow, lower[iVar], value[iVar], upper[iVar],
                  num_row_lower, num_row_upper, num_row_fixed, num_row_free);
  }
  HighsInt num_col_nonbasic =
      num_col_lower + num_col_upper + num_col_fixed + num_col_free;
  HighsInt num_row_nonbasic =
      num_row_lower + num_row_upper + num_row_fixed + num_row_free;
  assert(num_col_basic + num_row_basic == lp_.num_row_);
  assert(num_col_nonbasic + num_row_nonbasic == lp_.num_col_);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "For %d columns and %d rows\n"
              "   NonBasic |  Lower  Upper  Fixed   Free |    Basic\n"
              "Col %7d |%7d%7d%7d%7d |  %7d\n"
              "Row %7d |%7d%7d%7d%7d |  %7d\n"
              "----------------------------------------------------\n"
              "    %7d |%7d%7d%7d%7d |  %7d\n",
              (int)lp_.num_col_, (int)lp_.num_row_, (int)num_col_nonbasic,
              (int)num_col_lower, (int)num_col_upper, (int)num_col_fixed,
              (int)num_col_free, (int)num_col_basic, (int)num_row_nonbasic,
              (int)num_row_lower, (int)num_row_upper, (int)num_row_fixed,
              (int)num_row_free, (int)num_row_basic,
              (int)num_col_nonbasic + (int)num_row_nonbasic,
              (int)num_col_lower + (int)num_row_lower,
              (int)num_col_upper + (int)num_row_upper,
              (int)num_col_fixed + (int)num_row_fixed,
              (int)num_col_free + (int)num_row_free,
              (int)num_col_basic + (int)num_row_basic);
}